

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

bool __thiscall sptk::Matrix::GetDeterminant(Matrix *this,double *determinant)

{
  double dVar1;
  int iVar2;
  const_reference ppdVar3;
  double *pdVar4;
  Matrix *in_RSI;
  long in_RDI;
  double determinant_of_submatrix;
  int column;
  int offset;
  int row;
  int i;
  Matrix submatrix;
  int num_order;
  int num_dimension;
  double in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  double local_88;
  int local_70;
  int local_6c;
  int in_stack_ffffffffffffff98;
  int iVar5;
  int in_stack_ffffffffffffff9c;
  int iVar6;
  Matrix *in_stack_ffffffffffffffa0;
  int iVar7;
  bool local_1;
  
  if (((*(int *)(in_RDI + 8) == *(int *)(in_RDI + 0xc)) && (0 < *(int *)(in_RDI + 8))) &&
     (in_RSI != (Matrix *)0x0)) {
    iVar7 = *(int *)(in_RDI + 8);
    if (iVar7 == 1) {
      ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),0);
      in_RSI->_vptr_Matrix = (_func_int **)**ppdVar3;
      local_1 = true;
    }
    else {
      iVar2 = iVar7 + -1;
      Matrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      in_RSI->_vptr_Matrix = (_func_int **)0x0;
      for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        local_6c = 0;
        for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
          if (iVar6 == iVar5) {
            local_6c = 1;
          }
          for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
            ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                                 (long)(iVar5 + local_6c));
            dVar1 = (*ppdVar3)[(long)local_70 + 1];
            pdVar4 = operator[]((Matrix *)
                                CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            pdVar4[local_70] = dVar1;
          }
        }
        in_stack_ffffffffffffff57 = GetDeterminant(in_RSI,(double *)CONCAT44(iVar7,iVar2));
        if (!(bool)in_stack_ffffffffffffff57) {
          local_1 = false;
          goto LAB_001094c1;
        }
        if (iVar6 % 2 == 0) {
          ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                               (long)iVar6);
          in_stack_ffffffffffffff48 = **ppdVar3;
        }
        else {
          ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                               (long)iVar6);
          in_stack_ffffffffffffff48 = -**ppdVar3;
        }
        in_RSI->_vptr_Matrix =
             (_func_int **)(in_stack_ffffffffffffff48 * local_88 + (double)in_RSI->_vptr_Matrix);
      }
      local_1 = true;
LAB_001094c1:
      ~Matrix((Matrix *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Matrix::GetDeterminant(double* determinant) const {
  if (num_row_ != num_column_ || num_row_ <= 0 || NULL == determinant) {
    return false;
  }

  const int num_dimension(num_row_);
  if (1 == num_dimension) {
    *determinant = index_[0][0];
    return true;
  }

  const int num_order(num_dimension - 1);
  Matrix submatrix(num_order, num_order);
  *determinant = 0.0;
  for (int i(0); i < num_dimension; ++i) {
    for (int row(0), offset(0); row < num_order; ++row) {
      if (i == row) {
        offset = 1;
      }
      for (int column(0); column < num_order; ++column) {
        submatrix[row][column] = index_[row + offset][column + 1];
      }
    }
    double determinant_of_submatrix;
    if (!submatrix.GetDeterminant(&determinant_of_submatrix)) {
      return false;
    }
    *determinant += ((0 == i % 2) ? index_[i][0] : -index_[i][0]) *
                    determinant_of_submatrix;
  }
  return true;
}